

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

optional<std::vector<double,_std::allocator<double>_>_> *
pbrt::SplitStringToDoubles(string_view str,char ch)

{
  string_view str_00;
  size_type sVar1;
  reference this;
  char *in_RSI;
  optional<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  size_t i;
  vector<double,_std::allocator<double>_> doubles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  optional<std::vector<double,_std::allocator<double>_>_> *__n;
  vector<double,_std::allocator<double>_> *this_00;
  ulong local_80;
  double *in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffff90;
  char in_stack_ffffffffffffffaf;
  pointer in_stack_ffffffffffffffb0;
  vector<double,_std::allocator<double>_> local_38 [2];
  
  this_00 = local_38;
  str_00._M_str = in_RSI;
  str_00._M_len = (size_t)in_stack_ffffffffffffffb0;
  __n = in_RDI;
  SplitString_abi_cxx11_(str_00,in_stack_ffffffffffffffaf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00);
  std::allocator<double>::allocator((allocator<double> *)0x57c99f);
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(size_type)__n,(allocator_type *)in_RDI);
  std::allocator<double>::~allocator((allocator<double> *)0x57c9bf);
  local_80 = 0;
  do {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
    if (sVar1 <= local_80) {
      pstd::optional<std::vector<double,_std::allocator<double>_>_>::optional
                ((optional<std::vector<double,_std::allocator<double>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
LAB_0057cacc:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_RDI);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI);
      return __n;
    }
    this = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,local_80);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffa0,local_80);
    in_stack_ffffffffffffff37 = Atod(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!(bool)in_stack_ffffffffffffff37) {
      memset(in_RDI,0,0x20);
      pstd::optional<std::vector<double,_std::allocator<double>_>_>::optional(in_RDI);
      goto LAB_0057cacc;
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

pstd::optional<std::vector<double>> SplitStringToDoubles(std::string_view str, char ch) {
    std::vector<std::string> strs = SplitString(str, ch);
    std::vector<double> doubles(strs.size());

    for (size_t i = 0; i < strs.size(); ++i)
        if (!Atod(strs[i], &doubles[i]))
            return {};
    return doubles;
}